

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>::
reserve(vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_> *this
       ,size_t n)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  memory_resource *pmVar3;
  undefined8 uVar4;
  int iVar5;
  undefined4 extraout_var;
  long lVar6;
  int i;
  ulong uVar7;
  
  if (this->nAlloc < n) {
    pmVar3 = (this->alloc).memoryResource;
    iVar5 = (*pmVar3->_vptr_memory_resource[2])(pmVar3,n << 4,4);
    lVar6 = 0;
    for (uVar7 = 0; uVar7 < this->nStored; uVar7 = uVar7 + 1) {
      puVar1 = (undefined8 *)((long)&(this->ptr->pMin).super_Tuple2<pbrt::Point2,_float>.x + lVar6);
      uVar4 = puVar1[1];
      puVar2 = (undefined8 *)
               ((long)&(((Bounds2<float> *)CONCAT44(extraout_var,iVar5))->pMin).
                       super_Tuple2<pbrt::Point2,_float>.x + lVar6);
      *puVar2 = *puVar1;
      puVar2[1] = uVar4;
      lVar6 = lVar6 + 0x10;
    }
    pmVar3 = (this->alloc).memoryResource;
    (*pmVar3->_vptr_memory_resource[3])(pmVar3,this->ptr,this->nAlloc << 4,4);
    this->nAlloc = n;
    this->ptr = (Bounds2<float> *)CONCAT44(extraout_var,iVar5);
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }